

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

unsigned_long_long
el::base::utils::DateTime::getTimeDifference
          (timeval *endTime,timeval *startTime,TimestampUnit timestampUnit)

{
  long lVar1;
  
  if (timestampUnit != Microsecond) {
    lVar1 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(startTime->tv_usec),8);
    return (endTime->tv_sec - startTime->tv_sec) * 1000 +
           ((lVar1 >> 7) - (lVar1 >> 0x3f)) + endTime->tv_usec / 1000;
  }
  return (endTime->tv_usec - startTime->tv_usec) + (endTime->tv_sec - startTime->tv_sec) * 1000000;
}

Assistant:

unsigned long long DateTime::getTimeDifference(const struct timeval& endTime, const struct timeval& startTime,
    base::TimestampUnit timestampUnit) {
  if (timestampUnit == base::TimestampUnit::Microsecond) {
    return static_cast<unsigned long long>(static_cast<unsigned long long>(1000000 * endTime.tv_sec + endTime.tv_usec) -
                                           static_cast<unsigned long long>(1000000 * startTime.tv_sec + startTime.tv_usec));
  }
  // milliseconds
  auto conv = [](const struct timeval& tim) {
    return static_cast<unsigned long long>((tim.tv_sec * 1000) + (tim.tv_usec / 1000));
  };
  return static_cast<unsigned long long>(conv(endTime) - conv(startTime));
}